

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *output,size_t output_size,
                      size_t *output_length,uchar *tag,size_t tag_len)

{
  uchar *x;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined8 local_38;
  uint local_30;
  uint local_2c;
  
  *output_length = 0;
  uVar4 = ctx->len;
  uVar1 = ctx->add_len;
  if ((uVar1 & 0xf) != 0 && uVar4 == 0) {
    gcm_mult(ctx,ctx->buf,ctx->buf);
  }
  if (tag_len - 0x11 < 0xfffffffffffffff3) {
    iVar3 = -0x14;
  }
  else {
    if ((ctx->len & 0xf) != 0) {
      gcm_mult(ctx,ctx->buf,ctx->buf);
    }
    switchD_0193dc74::default(tag,ctx->base_ectr,tag_len);
    if (((uVar4 | uVar1) & 0x1fffffffffffffff) != 0) {
      uVar2 = (uint)((uVar1 << 3) >> 0x20);
      local_38._0_4_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (uint)(uVar1 << 3);
      local_38._4_4_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (uint)((uVar4 << 3) >> 0x20);
      local_30 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (uint)(uVar4 << 3);
      local_2c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      x = ctx->buf;
      for (uVar4 = 0; uVar4 < 9; uVar4 = uVar4 + 8) {
        *(ulong *)(ctx->buf + uVar4) =
             *(ulong *)(ctx->buf + uVar4) ^ *(ulong *)((long)&local_38 + uVar4);
      }
      gcm_mult(ctx,x,x);
      uVar4 = 0;
      while (uVar4 + 8 <= tag_len) {
        *(ulong *)(tag + uVar4) = *(ulong *)(tag + uVar4) ^ *(ulong *)(x + uVar4);
        uVar4 = uVar4 + 8;
      }
      for (; uVar4 < tag_len; uVar4 = uVar4 + 1) {
        tag[uVar4] = tag[uVar4] ^ x[uVar4];
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,
                       unsigned char *output, size_t output_size,
                       size_t *output_length,
                       unsigned char *tag, size_t tag_len)
{
    unsigned char work_buf[16];
    uint64_t orig_len;
    uint64_t orig_add_len;

    /* We never pass any output in finish(). The output parameter exists only
     * for the sake of alternative implementations. */
    (void) output;
    (void) output_size;
    *output_length = 0;

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * and AD length is restricted to 2^64 bits, ie 2^61 bytes so neither of
     * the two multiplications would overflow. */
    orig_len = ctx->len * 8;
    orig_add_len = ctx->add_len * 8;

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    if (tag_len > 16 || tag_len < 4) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    memcpy(tag, ctx->base_ectr, tag_len);

    if (orig_len || orig_add_len) {
        memset(work_buf, 0x00, 16);

        MBEDTLS_PUT_UINT32_BE((orig_add_len >> 32), work_buf, 0);
        MBEDTLS_PUT_UINT32_BE((orig_add_len), work_buf, 4);
        MBEDTLS_PUT_UINT32_BE((orig_len     >> 32), work_buf, 8);
        MBEDTLS_PUT_UINT32_BE((orig_len), work_buf, 12);

        mbedtls_xor(ctx->buf, ctx->buf, work_buf, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        mbedtls_xor(tag, tag, ctx->buf, tag_len);
    }

    return 0;
}